

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sndseq.cpp
# Opt level: O0

void __thiscall DSeqActorNode::MakeSound(DSeqActorNode *this,int loop,FSoundID *id)

{
  uint channel;
  AActor *ent;
  float volume;
  FSoundID local_24;
  FSoundID *local_20;
  FSoundID *id_local;
  DSeqActorNode *pDStack_10;
  int loop_local;
  DSeqActorNode *this_local;
  
  local_20 = id;
  id_local._4_4_ = loop;
  pDStack_10 = this;
  ent = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->m_Actor);
  channel = id_local._4_4_ | 4;
  FSoundID::FSoundID(&local_24,id);
  volume = clamp<float>((this->super_DSeqNode).m_Volume,0.0,1.0);
  S_Sound(ent,channel,&local_24,volume,(this->super_DSeqNode).m_Atten);
  return;
}

Assistant:

void MakeSound(int loop, FSoundID id)
	{
		S_Sound(m_Actor, CHAN_BODY|loop, id, clamp(m_Volume, 0.f, 1.f), m_Atten);
	}